

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_strerror.cc
# Opt level: O0

void __thiscall tcmalloc::SafeStrError::SafeStrError(SafeStrError *this,int errnum)

{
  char *pcVar1;
  int errnum_local;
  SafeStrError *this_local;
  
  pcVar1 = anon_unknown_1::TryMapErrno(errnum);
  this->result_ = pcVar1;
  if (this->result_ == (char *)0x0) {
    snprintf(this->buf_,0x20,"errno %d",(ulong)(uint)errnum);
    this->result_ = this->buf_;
  }
  return;
}

Assistant:

SafeStrError::SafeStrError(int errnum) {
  result_ = TryMapErrno(errnum);
  if (result_ == nullptr) {
    snprintf(buf_, sizeof(buf_), "errno %d", errnum);
    result_ = buf_;
  }
}